

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCInstPrinter.c
# Opt level: O3

void printcrbitm(MCInst *MI,uint OpNo,SStream *O)

{
  byte bVar1;
  uint uVar2;
  MCOperand *op;
  char *fmt;
  
  op = MCInst_getOperand(MI,OpNo);
  uVar2 = MCOperand_getReg(op);
  if (uVar2 - 0xc < 7) {
    bVar1 = (char)uVar2 - 0xb;
    fmt = &DAT_001e72f8 + *(int *)(&DAT_001e72f8 + (ulong)(uVar2 - 0xc) * 4);
  }
  else {
    fmt = "0x%x";
    bVar1 = 0;
  }
  SStream_concat(O,fmt,(ulong)(0x80 >> (bVar1 & 0x1f)));
  return;
}

Assistant:

static void printcrbitm(MCInst *MI, unsigned OpNo, SStream *O)
{
	unsigned RegNo, tmp;
	unsigned CCReg = MCOperand_getReg(MCInst_getOperand(MI, OpNo));

	switch (CCReg) {
		default: // llvm_unreachable("Unknown CR register");
		case PPC_CR0: RegNo = 0; break;
		case PPC_CR1: RegNo = 1; break;
		case PPC_CR2: RegNo = 2; break;
		case PPC_CR3: RegNo = 3; break;
		case PPC_CR4: RegNo = 4; break;
		case PPC_CR5: RegNo = 5; break;
		case PPC_CR6: RegNo = 6; break;
		case PPC_CR7: RegNo = 7; break;
	}

	tmp = 0x80 >> RegNo;
	if (tmp > HEX_THRESHOLD)
		SStream_concat(O, "0x%x", tmp);
	else
		SStream_concat(O, "%u", tmp);
}